

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O2

Territory __thiscall QTimeZonePrivate::territory(QTimeZonePrivate *this)

{
  bool bVar1;
  Territory TVar2;
  long lVar3;
  long in_FS_OFFSET;
  iterator __begin2;
  QLatin1StringView local_b8;
  undefined1 local_a8 [32];
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  QLatin1StringView local_68;
  QStringTokenizerBase<QLatin1String,_QChar> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.m_data = (this->m_id).d.ptr;
  local_68.m_size = (this->m_id).d.size;
  if (local_68.m_data == (char *)0x0) {
    local_68.m_data = &QByteArray::_empty;
  }
  lVar3 = 0;
  do {
    if (lVar3 == 0x876) {
      TVar2 = AnyCountry;
LAB_003aa88f:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return TVar2;
      }
      __stack_chk_fail();
    }
    local_58.m_haystack =
         QtTimeZoneCldr::ZoneData::id((ZoneData *)((long)&QtTimeZoneCldr::zoneDataTable + lVar3));
    local_58.super_QStringTokenizerBaseBase.m_sb.
    super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.super_QFlagsStorage<Qt::SplitBehaviorFlags>
    .i = (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)0x0;
    local_58.super_QStringTokenizerBaseBase.m_cs = CaseSensitive;
    local_58.m_needle.ucs = L' ';
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
    local_a8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_a8._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStringTokenizerBase<QLatin1String,_QChar>::iterator::iterator((iterator *)local_a8,&local_58);
    while (local_a8[0x18] == true) {
      local_b8.m_size = local_a8._8_8_;
      local_b8.m_data = (char *)local_a8._16_8_;
      bVar1 = ::comparesEqual(&local_b8,&local_68);
      if (bVar1) {
        TVar2 = *(Territory *)(&DAT_00532fd2 + lVar3);
        goto LAB_003aa88f;
      }
      QStringTokenizerBase<QLatin1String,_QChar>::iterator::advance((iterator *)local_a8);
    }
    lVar3 = lVar3 + 6;
  } while( true );
}

Assistant:

QLocale::Territory QTimeZonePrivate::territory() const
{
    // Default fall-back mode, use the zoneTable to find Region of known Zones
    const QLatin1StringView sought(m_id.data(), m_id.size());
    for (const ZoneData &data : zoneDataTable) {
        for (QLatin1StringView token : data.ids()) {
            if (token == sought)
                return QLocale::Territory(data.territory);
        }
    }
    return QLocale::AnyTerritory;
}